

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr.c
# Opt level: O2

int Saig_ManDetectConstr(Aig_Man_t *p,int iOut,Vec_Ptr_t **pvOuts,Vec_Ptr_t **pvCons)

{
  long lVar1;
  uint uVar2;
  void **ppvVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  Aig_Obj_t *pAVar7;
  Vec_Ptr_t *pVVar8;
  void *pvVar9;
  Vec_Ptr_t *vSuper2;
  Vec_Ptr_t *pVVar10;
  uint uVar11;
  undefined8 *puVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  char *__s;
  Vec_Ptr_t *local_58;
  Vec_Ptr_t *local_50;
  void *local_48;
  Vec_Ptr_t **local_40;
  Vec_Ptr_t *local_38;
  
  if ((iOut < 0) || (p->nTruePos <= iOut)) {
    __assert_fail("iOut >= 0 && iOut < Saig_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigConstr.c"
                  ,0xa3,"int Saig_ManDetectConstr(Aig_Man_t *, int, Vec_Ptr_t **, Vec_Ptr_t **)");
  }
  *pvOuts = (Vec_Ptr_t *)0x0;
  *pvCons = (Vec_Ptr_t *)0x0;
  pAVar7 = Aig_ManCo(p,iOut);
  pAVar7 = pAVar7->pFanin0;
  if (pAVar7 == (Aig_Obj_t *)((ulong)p->pConst1 ^ 1)) {
    pVVar8 = Vec_PtrAlloc(1);
    pVVar8->nSize = 1;
    ppvVar3 = pVVar8->pArray;
    *ppvVar3 = (void *)0x0;
    *ppvVar3 = p->pConst1;
    *pvOuts = pVVar8;
    pVVar8 = Vec_PtrAlloc(0);
    *pvCons = pVVar8;
    return -1;
  }
  if ((((ulong)pAVar7 & 1) == 0) && (0xfffffffd < (*(uint *)&pAVar7->field_0x18 & 7) - 7)) {
    local_40 = pvOuts;
    pVVar8 = Saig_DetectConstrCollectSuper(pAVar7);
    iVar6 = pVVar8->nSize;
    if (iVar6 < 2) {
      __assert_fail("Vec_PtrSize(vSuper) >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigConstr.c"
                    ,0xb5,"int Saig_ManDetectConstr(Aig_Man_t *, int, Vec_Ptr_t **, Vec_Ptr_t **)");
    }
    iVar14 = 0;
    for (iVar13 = 0; iVar6 != iVar13; iVar13 = iVar13 + 1) {
      pvVar9 = Vec_PtrEntry(pVVar8,iVar13);
      iVar5 = Saig_ObjIsLo(p,(Aig_Obj_t *)((ulong)pvVar9 & 0xfffffffffffffffe));
      iVar14 = iVar14 + iVar5;
    }
    if (iVar14 == 0) {
      puts("There is no flop outputs.");
      Vec_PtrFree(pVVar8);
      return 0;
    }
    local_50 = (Vec_Ptr_t *)0x0;
    for (iVar13 = 0; iVar6 != iVar13; iVar13 = iVar13 + 1) {
      pvVar9 = Vec_PtrEntry(pVVar8,iVar13);
      pAVar7 = (Aig_Obj_t *)((ulong)pvVar9 & 0xfffffffffffffffe);
      iVar14 = Saig_ObjIsLo(p,pAVar7);
      if (iVar14 != 0) {
        local_48 = pvVar9;
        iVar14 = Saig_ObjIsLo(p,pAVar7);
        if (iVar14 == 0) {
          __assert_fail("Saig_ObjIsLo(p, pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saig.h"
                        ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
        }
        local_38 = p->vCos;
        iVar14 = p->nTruePos;
        iVar5 = Aig_ObjCioId(pAVar7);
        pvVar9 = Vec_PtrEntry(local_38,(iVar14 + iVar5) - p->nTruePis);
        if (((*(ulong *)((long)pvVar9 + 8) & 1) != 0) &&
           (pAVar7 = (Aig_Obj_t *)(*(ulong *)((long)pvVar9 + 8) & 0xfffffffffffffffe),
           0xfffffffd < (*(uint *)&pAVar7->field_0x18 & 7) - 7)) {
          vSuper2 = Saig_DetectConstrCollectSuper(pAVar7);
          pVVar10 = Saig_ManDetectConstrCheckCont(pVVar8,vSuper2);
          if (pVVar10 != (Vec_Ptr_t *)0x0) {
            local_58 = pVVar10;
            if (((ulong)local_48 & 1) == 0) {
              iVar6 = Vec_PtrFind(vSuper2,local_48);
              if (iVar6 == -1) {
                puts("Cannot find special flop about the inputs of OR gate.");
                Vec_PtrFreeP(&local_58);
                Vec_PtrFree(vSuper2);
                pVVar10 = local_58;
              }
              else {
                uVar2 = vSuper2->nSize;
                lVar15 = (ulong)uVar2 * 8 + 8;
                uVar11 = uVar2;
                do {
                  if ((int)uVar11 < 1) {
                    __assert_fail("i >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                                  ,0x318,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
                  }
                  lVar1 = lVar15 + -8;
                  uVar11 = uVar11 - 1;
                  lVar4 = lVar15 + -0x10;
                  lVar15 = lVar1;
                } while (*(void **)((long)vSuper2->pArray + lVar4) != local_48);
                puVar12 = (undefined8 *)((long)vSuper2->pArray + lVar1);
                while (uVar11 = uVar11 + 1, (int)uVar11 < (int)uVar2) {
                  puVar12[-1] = *puVar12;
                  puVar12 = puVar12 + 1;
                }
                vSuper2->nSize = uVar2 - 1;
                pVVar10 = local_58;
              }
            }
            else {
              puts("Special flop input is complemented.");
              Vec_PtrFreeP(&local_58);
              Vec_PtrFree(vSuper2);
              pVVar10 = local_58;
            }
            goto LAB_0058c26e;
          }
          local_50 = vSuper2;
          Vec_PtrFree(vSuper2);
        }
      }
    }
    pVVar10 = (Vec_Ptr_t *)0x0;
    vSuper2 = local_50;
LAB_0058c26e:
    Vec_PtrFree(pVVar8);
    if (pVVar10 != (Vec_Ptr_t *)0x0) {
      printf("Output %d : Structural analysis found %d original properties and %d constraints.\n",
             (ulong)(uint)iOut,(ulong)(uint)pVVar10->nSize,(ulong)(uint)vSuper2->nSize);
      iVar6 = vSuper2->nSize;
      *local_40 = pVVar10;
      *pvCons = vSuper2;
      return iVar6;
    }
    __s = "There is no structural constraints.";
  }
  else {
    __s = "The output is not an AND.";
  }
  puts(__s);
  return 0;
}

Assistant:

int Saig_ManDetectConstr( Aig_Man_t * p, int iOut, Vec_Ptr_t ** pvOuts, Vec_Ptr_t ** pvCons )
{
    Vec_Ptr_t * vSuper, * vSuper2 = NULL, * vUnique;
    Aig_Obj_t * pObj, * pObj2, * pFlop;
    int i, nFlops, RetValue;
    assert( iOut >= 0 && iOut < Saig_ManPoNum(p) );
    *pvOuts = NULL;
    *pvCons = NULL;
    pObj = Aig_ObjChild0( Aig_ManCo(p, iOut) );
    if ( pObj == Aig_ManConst0(p) )
    {
        vUnique = Vec_PtrStart( 1 );
        Vec_PtrWriteEntry( vUnique, 0, Aig_ManConst1(p) );
        *pvOuts = vUnique;
        *pvCons = Vec_PtrAlloc( 0 );
        return -1;
    }
    if ( Aig_IsComplement(pObj) || !Aig_ObjIsNode(pObj) )
    {
        printf( "The output is not an AND.\n" );
        return 0;
    }
    vSuper = Saig_DetectConstrCollectSuper( pObj );
    assert( Vec_PtrSize(vSuper) >= 2 );
    nFlops = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pObj, i )
        nFlops += Saig_ObjIsLo( p, Aig_Regular(pObj) );
    if ( nFlops == 0 )
    {
        printf( "There is no flop outputs.\n" );
        Vec_PtrFree( vSuper );
        return 0;
    }
    // try flops 
    vUnique = NULL;
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pObj, i )
    {
        pFlop = Aig_Regular( pObj );
        if ( !Saig_ObjIsLo(p, pFlop) )
            continue;
        pFlop = Saig_ObjLoToLi( p, pFlop );
        pObj2 = Aig_ObjChild0( pFlop );
        if ( !Aig_IsComplement(pObj2) || !Aig_ObjIsNode(Aig_Regular(pObj2)) )
            continue;
        vSuper2 = Saig_DetectConstrCollectSuper( Aig_Regular(pObj2) );
        // every node in vSuper2 should appear in vSuper
        vUnique = Saig_ManDetectConstrCheckCont( vSuper, vSuper2 );
        if ( vUnique != NULL )
        {
///           assert( !Aig_IsComplement(pObj) );
 //           assert( Vec_PtrFind( vSuper2, pObj ) >= 0 );
            if ( Aig_IsComplement(pObj) )
            {
                printf( "Special flop input is complemented.\n" );
                Vec_PtrFreeP( &vUnique );
                Vec_PtrFree( vSuper2 );
                break;
            }
            if ( Vec_PtrFind( vSuper2, pObj ) == -1 )
            {
                printf( "Cannot find special flop about the inputs of OR gate.\n" );
                Vec_PtrFreeP( &vUnique );
                Vec_PtrFree( vSuper2 );
                break;
            }
            // remove the flop output
            Vec_PtrRemove( vSuper2, pObj );
            break;
        }
        Vec_PtrFree( vSuper2 );
    }
    Vec_PtrFree( vSuper );
    if ( vUnique == NULL )
    {
        printf( "There is no structural constraints.\n" );
        return 0;
    }
    // vUnique contains unique entries
    // vSuper2 contains the supergate
    printf( "Output %d : Structural analysis found %d original properties and %d constraints.\n", 
        iOut, Vec_PtrSize(vUnique), Vec_PtrSize(vSuper2) );
    // remember the number of constraints
    RetValue = Vec_PtrSize(vSuper2);
    // make the AND of properties 
//    Vec_PtrFree( vUnique );
//    Vec_PtrFree( vSuper2 );
    *pvOuts = vUnique;
    *pvCons = vSuper2;
    return RetValue;
}